

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_if_suite.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  
  find_null();
  find_boolean();
  find_integer();
  find_real();
  find_string();
  find_wstring();
  find_u16string();
  find_u32string();
  find_array();
  find_map();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    find_null();
    find_boolean();
    find_integer();
    find_real();
    find_string();
    find_wstring();
    find_u16string();
    find_u32string();
    find_array();
    find_map();

    return boost::report_errors();
}